

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O2

void __thiscall glcts::anon_unknown_0::ImageSizeMachine::~ImageSizeMachine(ImageSizeMachine *this)

{
  ~ImageSizeMachine(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~ImageSizeMachine()
	{
		if (pipeline)
		{
			glDeleteProgramPipelines(1, &m_pipeline);
			for (int i = 0; i < 3; ++i)
				glDeleteProgram(m_program[i]);
		}
		else
		{
			glDeleteProgram(m_program[0]);
		}
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteBuffers(1, &m_buffer);
		glDeleteTransformFeedbacks(1, &m_xfb_id);
	}